

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Little_Hexy.cpp
# Opt level: O3

void __thiscall
chrono::copter::Little_Hexy::AddCollisionShapes
          (Little_Hexy *this,shared_ptr<chrono::ChMaterialSurface> *material)

{
  element_type *peVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ChMatrix33<double> matr;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined1 local_60 [32];
  double local_40;
  undefined1 auStack_38 [24];
  double local_20;
  
  peVar1 = (this->super_Copter<6>).chassis.
           super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar2 = *(long **)(peVar1 + 0x198);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar2 + 0x18))();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar1 = (this->super_Copter<6>).chassis.
           super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar2 = *(long **)(peVar1 + 0x198);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_88 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  p_Stack_80 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
  p_Var4 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_78 = ZEXT816(0) << 0x20;
  local_68 = 0;
  local_60._8_24_ = SUB3224(ZEXT832(0),0) << 0x20;
  auStack_38 = SUB3224(ZEXT832(0),4);
  local_60._0_8_ = 1.0;
  local_40 = 1.0;
  local_20 = 1.0;
  (**(code **)(*plVar2 + 0x38))(plVar2,&local_88);
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  ChMatrix33<double>::ChMatrix33
            ((ChMatrix33<double> *)local_60,(ChQuaternion<double> *)&Q_ROTATE_Y_TO_Z);
  peVar1 = (this->super_Copter<6>).chassis.
           super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar2 = *(long **)(peVar1 + 0x198);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_98 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  p_Stack_90 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
  p_Var4 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_78 = ZEXT816(0) << 0x20;
  local_68 = 0x3fd1cfaacd9e83e4;
  (**(code **)(*plVar2 + 0x40))
            (0x3ff190ff97247454,0x3ff190ff97247454,0x3fb999999999999a,plVar2,&local_98,local_78,
             local_60);
  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar1 = (this->super_Copter<6>).chassis.
           super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar2 = *(long **)(peVar1 + 0x198);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar2 + 0x20))();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  chrono::ChBody::SetCollide
            (SUB81((this->super_Copter<6>).chassis.
                   super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  return;
}

Assistant:

void Little_Hexy::AddCollisionShapes(std::shared_ptr<ChMaterialSurface> material) {
    chassis->GetCollisionModel()->ClearModel();
    // Legs and body boundary box
    chassis->GetCollisionModel()->AddBox(material, 0.279, 0.279, 0.46);
    // Arms and propellers boundary cylinder
    // propeller arm + propeller radius
    double radius = 0.762 + 0.6718 / 2;
    ChMatrix33<> matr(Q_ROTATE_Y_TO_Z);
    chassis->GetCollisionModel()->AddCylinder(material, radius, radius, 0.1, ChVector<>(0, 0, 0.2783), matr);
    chassis->GetCollisionModel()->BuildModel();
    chassis->SetCollide(true);
}